

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charls_jpegls_encoder.cpp
# Opt level: O0

void __thiscall
charls_jpegls_encoder::encode_scan
          (charls_jpegls_encoder *this,byte_span source,size_t stride,int32_t component_count)

{
  int iVar1;
  pointer peVar2;
  undefined4 extraout_var;
  byte_span bVar3;
  uint8_t *local_a8;
  size_t local_a0;
  unique_ptr<charls::process_line,_std::default_delete<charls::process_line>_> local_98;
  size_t local_90;
  size_t bytes_written;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  unique_ptr<charls::process_line,_std::default_delete<charls::process_line>_> local_68;
  unique_ptr<charls::process_line,_std::default_delete<charls::process_line>_> process_line;
  undefined1 local_49;
  unique_ptr<charls::encoder_strategy,_std::default_delete<charls::encoder_strategy>_> local_48;
  unique_ptr<charls::encoder_strategy,_std::default_delete<charls::encoder_strategy>_> codec;
  frame_info frame_info;
  int32_t component_count_local;
  size_t stride_local;
  charls_jpegls_encoder *this_local;
  byte_span source_local;
  
  codec._M_t.
  super___uniq_ptr_impl<charls::encoder_strategy,_std::default_delete<charls::encoder_strategy>_>.
  _M_t.
  super__Tuple_impl<0UL,_charls::encoder_strategy_*,_std::default_delete<charls::encoder_strategy>_>
  .super__Head_base<0UL,_charls::encoder_strategy_*,_false>._M_head_impl._4_4_ =
       (this->frame_info_).width;
  process_line._M_t.
  super___uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>._M_t.
  super__Tuple_impl<0UL,_charls::process_line_*,_std::default_delete<charls::process_line>_>.
  super__Head_base<0UL,_charls::process_line_*,_false>._M_head_impl._0_4_ = this->near_lossless_;
  process_line._M_t.
  super___uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>._M_t.
  super__Tuple_impl<0UL,_charls::process_line_*,_std::default_delete<charls::process_line>_>.
  super__Head_base<0UL,_charls::process_line_*,_false>._M_head_impl._4_4_ = 0;
  charls::jls_codec_factory<charls::encoder_strategy>::create_codec
            ((jls_codec_factory<charls::encoder_strategy> *)&local_48,(frame_info *)&local_49,
             (coding_parameters *)
             ((long)&codec._M_t.
                     super___uniq_ptr_impl<charls::encoder_strategy,_std::default_delete<charls::encoder_strategy>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_charls::encoder_strategy_*,_std::default_delete<charls::encoder_strategy>_>
                     .super__Head_base<0UL,_charls::encoder_strategy_*,_false>._M_head_impl + 4),
             (jpegls_pc_parameters *)&process_line);
  peVar2 = std::unique_ptr<charls::encoder_strategy,_std::default_delete<charls::encoder_strategy>_>
           ::operator->(&local_48);
  this_local._0_4_ = source.data._0_4_;
  this_local._4_4_ = source.data._4_4_;
  source_local.data._0_4_ = (undefined4)source.size;
  source_local.data._4_4_ = source.size._4_4_;
  local_78 = this_local._0_4_;
  uStack_74 = this_local._4_4_;
  uStack_70 = source_local.data._0_4_;
  uStack_6c = source_local.data._4_4_;
  (*peVar2->_vptr_encoder_strategy[2])(&local_68,peVar2,source.data,source.size,stride);
  peVar2 = std::unique_ptr<charls::encoder_strategy,_std::default_delete<charls::encoder_strategy>_>
           ::operator->(&local_48);
  std::unique_ptr<charls::process_line,_std::default_delete<charls::process_line>_>::unique_ptr
            (&local_98,&local_68);
  bVar3 = charls::jpeg_stream_writer::remaining_destination(&this->writer_);
  local_a8 = bVar3.data;
  local_a0 = bVar3.size;
  iVar1 = (*peVar2->_vptr_encoder_strategy[4])(peVar2,&local_98,local_a8,local_a0);
  std::unique_ptr<charls::process_line,_std::default_delete<charls::process_line>_>::~unique_ptr
            (&local_98);
  local_90 = CONCAT44(extraout_var,iVar1);
  charls::jpeg_stream_writer::seek(&this->writer_,CONCAT44(extraout_var,iVar1));
  std::unique_ptr<charls::process_line,_std::default_delete<charls::process_line>_>::~unique_ptr
            (&local_68);
  std::unique_ptr<charls::encoder_strategy,_std::default_delete<charls::encoder_strategy>_>::
  ~unique_ptr(&local_48);
  return;
}

Assistant:

void encode_scan(const byte_span source, const size_t stride, const int32_t component_count)
    {
        const charls::frame_info frame_info{frame_info_.width, frame_info_.height, frame_info_.bits_per_sample,
                                            component_count};

        const auto codec{jls_codec_factory<encoder_strategy>().create_codec(
            frame_info, {near_lossless_, 0, interleave_mode_, color_transformation_, false}, preset_coding_parameters_)};
        std::unique_ptr<process_line> process_line(codec->create_process_line(source, stride));
        const size_t bytes_written{codec->encode_scan(std::move(process_line), writer_.remaining_destination())};

        // Synchronize the destination encapsulated in the writer (encode_scan works on a local copy)
        writer_.seek(bytes_written);
    }